

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.h
# Opt level: O3

void __thiscall chrono::robosimian::RS_DriverCallback::~RS_DriverCallback(RS_DriverCallback *this)

{
  operator_delete(this,0x20);
  return;
}

Assistant:

class CH_MODELS_API RS_DriverCallback : public RS_Driver::PhaseChangeCallback {
  public:
    RS_DriverCallback(RoboSimian* robot) : m_start_x(0), m_start_time(0), m_robot(robot) {}
    virtual void OnPhaseChange(RS_Driver::Phase old_phase, RS_Driver::Phase new_phase) override;

    /// Get distance traveled from last phase change.
    double GetDistance() const { return m_robot->GetChassisPos().x() - m_start_x; }
    /// Get time elapsed since last phase change.
    double GetDuration() const { return m_robot->GetSystem()->GetChTime() - m_start_time; }
    /// Get average robot speed since last phase change.
    double GetAvgSpeed() const { return GetDistance() / GetDuration(); }

    double m_start_x;     ///< location at start of current phase
    double m_start_time;  ///< time at start of current phase

  private:
    RoboSimian* m_robot;
}